

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::getUncompressedObject
          (QPDF *this,QPDFObjectHandle *obj,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *object_stream_data)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar5;
  QPDFObjectHandle QVar6;
  int local_3c;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_38;
  int local_30;
  int local_2c;
  int repl;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *object_stream_data_local;
  QPDFObjectHandle *obj_local;
  QPDF *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  _repl = in_RCX;
  object_stream_data_local = object_stream_data;
  obj_local = obj;
  this_local = this;
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)object_stream_data);
  this_00 = _repl;
  bVar5 = true;
  if (!bVar1) {
    local_2c = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data_local);
    sVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                      (this_00,&local_2c);
    bVar5 = sVar2 == 0;
  }
  if (bVar5) {
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)this,(QPDFObjectHandle *)object_stream_data_local);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    local_3c = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data_local);
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                   (_repl,&local_3c);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*(&local_38);
    local_30 = ppVar3->second;
    QVar6 = getObject(this,(int)obj,local_30);
    _Var4._M_pi = QVar6.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getUncompressedObject(QPDFObjectHandle& obj, std::map<int, int> const& object_stream_data)
{
    if (obj.isNull() || (object_stream_data.count(obj.getObjectID()) == 0)) {
        return obj;
    } else {
        int repl = (*(object_stream_data.find(obj.getObjectID()))).second;
        return getObject(repl, 0);
    }
}